

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmInstructionType
anon_unknown.dwarf_13465d::GetStoreInstruction(ExpressionContext *ctx,TypeBase *type)

{
  ulong uVar1;
  bool bVar2;
  
  if (ctx->typeBool == type) {
    return VM_INST_STORE_BYTE;
  }
  if (ctx->typeChar == type) {
    return VM_INST_STORE_BYTE;
  }
  if (ctx->typeShort == type) {
    return VM_INST_STORE_SHORT;
  }
  if (ctx->typeInt == type) {
    return VM_INST_STORE_INT;
  }
  if (ctx->typeFloat == type) {
    return VM_INST_STORE_FLOAT;
  }
  if (ctx->typeDouble == type) {
    return VM_INST_STORE_DOUBLE;
  }
  if (ctx->typeLong == type) {
    return VM_INST_STORE_LONG;
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID == 0x12) {
      return VM_INST_STORE_LONG;
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 0x19) {
        return VM_INST_STORE_INT;
      }
      if (type != (TypeBase *)0x0) {
        if (type->typeID == 0x15) {
          return VM_INST_STORE_STRUCT;
        }
        if (type != (TypeBase *)0x0) {
          bVar2 = type->typeID == 0x14;
          goto LAB_001bfa93;
        }
      }
    }
  }
  bVar2 = false;
LAB_001bfa93:
  if (bVar2) {
    return VM_INST_STORE_STRUCT;
  }
  if (ctx->typeAutoRef == (TypeStruct *)type) {
    return VM_INST_STORE_STRUCT;
  }
  if (ctx->typeAutoArray == (TypeStruct *)type) {
    return VM_INST_STORE_STRUCT;
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID == 9) {
      return VM_INST_STORE_INT;
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 10) {
        return VM_INST_STORE_INT;
      }
      if (type != (TypeBase *)0x0) {
        if (type->typeID == 0x19) {
          return VM_INST_STORE_INT;
        }
        if ((type != (TypeBase *)0x0) && (type->typeID == 0xb)) {
          return VM_INST_STORE_LONG;
        }
      }
    }
  }
  uVar1 = type->size;
  if (uVar1 == 0) {
    __assert_fail("type->size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1ba,
                  "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                 );
  }
  if ((uVar1 & 3) != 0) {
    __assert_fail("type->size % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1bb,
                  "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                 );
  }
  if (0xfffffff < (long)uVar1) {
    __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1bc,
                  "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                 );
  }
  return VM_INST_STORE_STRUCT;
}

Assistant:

VmInstructionType GetStoreInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_STORE_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_STORE_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_STORE_INT;

		if(type == ctx.typeFloat)
			return VM_INST_STORE_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_STORE_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_STORE_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_STORE_POINTER;

		if(isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeFunction>(type) || isType<TypeUnsizedArray>(type) || type == ctx.typeAutoRef || type == ctx.typeAutoArray)
			return VM_INST_STORE_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_STORE_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_STORE_STRUCT;
	}